

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int session_handle_invalid_stream2
              (nghttp2_session *session,int32_t stream_id,nghttp2_frame *frame,int lib_error_code)

{
  nghttp2_on_invalid_frame_recv_callback p_Var1;
  uint32_t error_code;
  int iVar2;
  
  error_code = get_error_code_from_lib_error_code(lib_error_code);
  iVar2 = nghttp2_session_add_rst_stream(session,stream_id,error_code);
  if (iVar2 == 0) {
    p_Var1 = (session->callbacks).on_invalid_frame_recv_callback;
    if ((p_Var1 != (nghttp2_on_invalid_frame_recv_callback)0x0) &&
       (iVar2 = (*p_Var1)(session,frame,lib_error_code,session->user_data), iVar2 != 0)) {
      return -0x386;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int session_handle_invalid_stream2(nghttp2_session *session,
                                          int32_t stream_id,
                                          nghttp2_frame *frame,
                                          int lib_error_code) {
  int rv;
  rv = nghttp2_session_add_rst_stream(
      session, stream_id, get_error_code_from_lib_error_code(lib_error_code));
  if (rv != 0) {
    return rv;
  }
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
            session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}